

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/application.cpp:81:33)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_application_cpp:81:33)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  Application *pAVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  ulong __val;
  string __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pAVar1 = (this->f).this;
  iVar4 = ParseStream::getInt(this_00);
  pAVar1->verbosity = iVar4;
  uVar8 = (ulong)iVar4;
  __val = -uVar8;
  if (0 < (long)uVar8) {
    __val = uVar8;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00138765;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00138765;
      }
      if (uVar6 < 10000) goto LAB_00138765;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00138765:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(iVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_70[0] + -((long)uVar8 >> 0x3f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x250a9e);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&pAVar1->rtcore,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }